

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void * sqlite3_column_name16(sqlite3_stmt *pStmt,int N)

{
  long lVar1;
  void *pvVar2;
  
  if ((uint)N < (uint)*(ushort *)(pStmt + 0x48)) {
    lVar1 = *(long *)pStmt;
    if (*(sqlite3_mutex **)(lVar1 + 0x18) != (sqlite3_mutex *)0x0) {
      (*sqlite3Config.mutex.xMutexEnter)(*(sqlite3_mutex **)(lVar1 + 0x18));
    }
    pvVar2 = sqlite3ValueText((sqlite3_value *)((ulong)(uint)N * 0x38 + *(long *)(pStmt + 0x20)),
                              '\x02');
    if (*(char *)(lVar1 + 0x50) != '\0') {
      *(undefined1 *)(lVar1 + 0x50) = 0;
      pvVar2 = (void *)0x0;
    }
    if (*(sqlite3_mutex **)(lVar1 + 0x18) != (sqlite3_mutex *)0x0) {
      (*sqlite3Config.mutex.xMutexLeave)(*(sqlite3_mutex **)(lVar1 + 0x18));
    }
  }
  else {
    pvVar2 = (void *)0x0;
  }
  return pvVar2;
}

Assistant:

SQLITE_API const void *sqlite3_column_name16(sqlite3_stmt *pStmt, int N){
  return columnName(
      pStmt, N, (const void*(*)(Mem*))sqlite3_value_text16, COLNAME_NAME);
}